

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void __thiscall VmFunction::UpdateDominatorTree(VmFunction *this,VmModule *module,bool clear)

{
  SmallArray<VmBlock_*,_4U> *this_00;
  VmValue *pVVar1;
  VmBlock **ppVVar2;
  long lVar3;
  VmBlock *pVVar4;
  bool bVar5;
  VmBlock *curr;
  VmBlock *pVVar6;
  VmBlock *pVVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  VmBlock *pVVar11;
  uint i;
  ulong uVar12;
  VmBlock *pVVar13;
  ulong uVar14;
  VmBlock *curr_1;
  VmBlock *pVVar15;
  uint postOrder;
  uint preOrder;
  SmallArray<VmBlock_*,_32U> blocksPostOrder;
  uint local_150 [2];
  SmallArray<VmBlock_*,_32U> local_148;
  
  pVVar6 = this->firstBlock;
  if (pVVar6 != (VmBlock *)0x0) {
    do {
      if (clear) {
        (pVVar6->predecessors).count = 0;
        (pVVar6->successors).count = 0;
      }
      pVVar6->visited = false;
      pVVar6->idom = (VmBlock *)0x0;
      (pVVar6->dominanceFrontier).count = 0;
      (pVVar6->dominanceChildren).count = 0;
      pVVar6 = pVVar6->nextSibling;
    } while (pVVar6 != (VmBlock *)0x0);
    pVVar6 = this->firstBlock;
    if (pVVar6 == (VmBlock *)0x0) {
      pVVar6 = (VmBlock *)0x0;
    }
    else {
      do {
        uVar8 = (pVVar6->super_VmValue).users.count;
        if (uVar8 != 0) {
          uVar12 = 0;
          do {
            pVVar1 = (pVVar6->super_VmValue).users.data[uVar12];
            if (((pVVar1 != (VmValue *)0x0) && (pVVar1->typeID == 2)) &&
               (*(int *)&pVVar1[1]._vptr_VmValue != 0x4d)) {
              uVar8 = (pVVar6->predecessors).count;
              if (uVar8 == (pVVar6->predecessors).max) {
                SmallArray<VmBlock_*,_4U>::grow(&pVVar6->predecessors,uVar8);
              }
              ppVVar2 = (pVVar6->predecessors).data;
              if (ppVVar2 == (VmBlock **)0x0) goto LAB_00270cd9;
              pVVar13 = (VmBlock *)pVVar1[1].users.data;
              uVar8 = (pVVar6->predecessors).count;
              (pVVar6->predecessors).count = uVar8 + 1;
              ppVVar2[uVar8] = pVVar13;
              uVar8 = (pVVar13->successors).count;
              if (uVar8 == (pVVar13->successors).max) {
                SmallArray<VmBlock_*,_4U>::grow(&pVVar13->successors,uVar8);
              }
              ppVVar2 = (pVVar13->successors).data;
              if (ppVVar2 == (VmBlock **)0x0) goto LAB_00270cd9;
              uVar8 = (pVVar13->successors).count;
              (pVVar13->successors).count = uVar8 + 1;
              ppVVar2[uVar8] = pVVar6;
              uVar8 = (pVVar6->super_VmValue).users.count;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar8);
        }
        pVVar6 = pVVar6->nextSibling;
      } while (pVVar6 != (VmBlock *)0x0);
      pVVar6 = this->firstBlock;
    }
    pVVar6->idom = pVVar6;
    local_148.allocator = module->allocator;
    local_148.data = local_148.little;
    local_148.count = 0;
    local_148.max = 0x20;
    local_150[1] = 0;
    local_150[0] = 0;
    anon_unknown.dwarf_22bf96::GetAndNumberControlGraphNodesDfs
              (&local_148,pVVar6,local_150 + 1,local_150);
    if (1 < local_148.count) {
      uVar12 = 0;
      uVar8 = local_148.count;
      do {
        uVar8 = uVar8 - 1;
        if (local_148.count <= uVar8) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmBlock *, 32>::operator[](unsigned int) [T = VmBlock *, N = 32]"
                       );
        }
        pVVar6 = local_148.data[uVar12];
        local_148.data[uVar12] = local_148.data[uVar8];
        local_148.data[uVar8] = pVVar6;
        uVar12 = uVar12 + 1;
      } while (local_148.count >> 1 != uVar12);
    }
    pVVar6 = this->firstBlock;
    uVar12 = 0;
    bVar5 = false;
    do {
      for (; bVar10 = bVar5, (uint)uVar12 < local_148.count; uVar12 = (ulong)((uint)uVar12 + 1)) {
        pVVar13 = local_148.data[uVar12];
        if (pVVar13 != pVVar6) {
          uVar9 = (ulong)(pVVar13->predecessors).count;
          if (uVar9 == 0) {
LAB_00270cf8:
            __assert_fail("firstProcessed",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x8cc,"void VmFunction::UpdateDominatorTree(VmModule *, bool)");
          }
          uVar14 = 1;
          do {
            pVVar7 = (pVVar13->predecessors).data[uVar14 - 1];
            pVVar11 = pVVar7->idom;
            if (pVVar7->idom != (VmBlock *)0x0) {
              pVVar11 = pVVar7;
            }
          } while ((uVar14 < uVar9) && (uVar14 = uVar14 + 1, pVVar11 == (VmBlock *)0x0));
          if (pVVar11 == (VmBlock *)0x0) goto LAB_00270cf8;
          if (uVar9 != 0) {
            uVar14 = 0;
            do {
              pVVar15 = (pVVar13->predecessors).data[uVar14];
              pVVar4 = pVVar7;
              if ((pVVar15 != pVVar11) && (pVVar15->idom != (VmBlock *)0x0)) {
                while (pVVar4 = pVVar15, pVVar15 != pVVar7) {
                  uVar8 = pVVar7->controlGraphPostOrderId;
                  for (; pVVar15->controlGraphPostOrderId < uVar8; pVVar15 = pVVar15->idom) {
                  }
                  while (uVar8 < pVVar15->controlGraphPostOrderId) {
                    pVVar7 = pVVar7->idom;
                    uVar8 = pVVar7->controlGraphPostOrderId;
                  }
                }
              }
              pVVar7 = pVVar4;
              uVar14 = uVar14 + 1;
            } while (uVar14 != uVar9);
          }
          if (pVVar13->idom != pVVar7) {
            pVVar13->idom = pVVar7;
            bVar10 = true;
          }
        }
        bVar5 = bVar10;
      }
      uVar12 = 0;
      bVar5 = false;
    } while (bVar10);
    pVVar6 = this->firstBlock;
    pVVar6->idom = (VmBlock *)0x0;
    do {
      if (pVVar6->visited == true) {
        uVar8 = (pVVar6->predecessors).count;
        if (1 < uVar8) {
          uVar12 = 0;
          do {
            pVVar13 = (pVVar6->predecessors).data[uVar12];
            if ((pVVar13->visited == true) && (pVVar7 = pVVar6->idom, pVVar13 != pVVar7)) {
              do {
                this_00 = &pVVar13->dominanceFrontier;
                uVar8 = (pVVar13->dominanceFrontier).count;
                if ((ulong)uVar8 == 0) {
LAB_00270bc4:
                  if (uVar8 == (pVVar13->dominanceFrontier).max) {
                    SmallArray<VmBlock_*,_4U>::grow(this_00,uVar8);
                  }
                  if (this_00->data == (VmBlock **)0x0) goto LAB_00270cd9;
                  uVar8 = (pVVar13->dominanceFrontier).count;
                  (pVVar13->dominanceFrontier).count = uVar8 + 1;
                  this_00->data[uVar8] = pVVar6;
                  pVVar7 = pVVar6->idom;
                }
                else {
                  uVar9 = 1;
                  do {
                    lVar3 = uVar9 - 1;
                    if (uVar8 <= uVar9) break;
                    uVar9 = uVar9 + 1;
                  } while (this_00->data[lVar3] != pVVar6);
                  if (this_00->data[lVar3] != pVVar6) goto LAB_00270bc4;
                }
                pVVar13 = pVVar13->idom;
              } while (pVVar13 != pVVar7);
              uVar8 = (pVVar6->predecessors).count;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 < uVar8);
        }
        pVVar13 = pVVar6->idom;
        if (pVVar13 != (VmBlock *)0x0) {
          uVar8 = (pVVar13->dominanceChildren).count;
          if (uVar8 == (pVVar13->dominanceChildren).max) {
            SmallArray<VmBlock_*,_4U>::grow(&pVVar13->dominanceChildren,uVar8);
          }
          ppVVar2 = (pVVar13->dominanceChildren).data;
          if (ppVVar2 == (VmBlock **)0x0) {
LAB_00270cd9:
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<VmBlock *, 4>::push_back(const T &) [T = VmBlock *, N = 4]"
                         );
          }
          uVar8 = (pVVar13->dominanceChildren).count;
          (pVVar13->dominanceChildren).count = uVar8 + 1;
          ppVVar2[uVar8] = pVVar6;
        }
      }
      pVVar6 = pVVar6->nextSibling;
    } while (pVVar6 != (VmBlock *)0x0);
    pVVar6 = this->firstBlock;
    if (pVVar6 == (VmBlock *)0x0) {
      pVVar6 = (VmBlock *)0x0;
    }
    else {
      do {
        pVVar6->visited = false;
        pVVar6 = pVVar6->nextSibling;
      } while (pVVar6 != (VmBlock *)0x0);
      pVVar6 = this->firstBlock;
    }
    local_150[1] = 0;
    local_150[0] = 0;
    anon_unknown.dwarf_22bf96::NumberDominanceGraphNodesDfs(pVVar6,local_150 + 1,local_150);
    SmallArray<VmBlock_*,_32U>::~SmallArray(&local_148);
  }
  return;
}

Assistant:

void VmFunction::UpdateDominatorTree(VmModule *module, bool clear)
{
	if(!firstBlock)
		return;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(clear)
		{
			curr->predecessors.clear();
			curr->successors.clear();
		}

		curr->visited = false;
		curr->idom = NULL;
		curr->dominanceFrontier.clear();
		curr->dominanceChildren.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	firstBlock->idom = firstBlock;

	SmallArray<VmBlock*, 32> blocksPostOrder(module->allocator);
	unsigned preOrder = 0;
	unsigned postOrder = 0;

	GetAndNumberControlGraphNodesDfs(blocksPostOrder, firstBlock, preOrder, postOrder);

	// Get nodes in reverse post order
	for(unsigned i = 0; i < blocksPostOrder.size() / 2; i++)
	{
		VmBlock *tmp = blocksPostOrder[i];
		blocksPostOrder[i] = blocksPostOrder[blocksPostOrder.size() - i - 1];
		blocksPostOrder[blocksPostOrder.size() - i - 1] = tmp;
	}

	bool changed = true;

	while(changed)
	{
		changed = false;

		for(unsigned i = 0; i < blocksPostOrder.size(); i++)
		{
			VmBlock *b = blocksPostOrder[i];

			if(b == firstBlock)
				continue;

			VmBlock *firstProcessed = NULL;

			for(unsigned k = 0; k < b->predecessors.size() && !firstProcessed; k++)
			{
				if(b->predecessors[k]->idom)
					firstProcessed = b->predecessors[k];
			}

			assert(firstProcessed);
			VmBlock *newIdom = firstProcessed;

			for(unsigned k = 0; k < b->predecessors.size(); k++)
			{
				VmBlock *p = b->predecessors[k];

				if(p == firstProcessed)
					continue;

				if(p->idom)
					newIdom = BlockIdomIntersect(p, newIdom);
			}

			if(b->idom != newIdom)
			{
				b->idom = newIdom;
				changed = true;
			}
		}
	}

	firstBlock->idom = NULL;

	// Fill the dominance frontier and dominator tree children
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(!curr->visited)
			continue;

		if(curr->predecessors.size() >= 2)
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *p = curr->predecessors[i];

				if(!p->visited)
					continue;

				VmBlock *runner = p;

				while(runner != curr->idom)
				{
					bool found = false;
					for(unsigned k = 0; k < runner->dominanceFrontier.size() && !found; k++)
					{
						if(runner->dominanceFrontier[k] == curr)
							found = true;
					}
					if(!found)
						runner->dominanceFrontier.push_back(curr);

					runner = runner->idom;
				}
			}
		}

		if(curr->idom)
			curr->idom->dominanceChildren.push_back(curr);
	}

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	preOrder = 0;
	postOrder = 0;
	NumberDominanceGraphNodesDfs(firstBlock, preOrder, postOrder);
}